

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkedAllocator.c
# Opt level: O1

sysbvm_chunkedAllocatorChunk_t *
sysbvm_chunkedAllocator_ensureChunkWithRequiredCapacity
          (sysbvm_chunkedAllocator_t *allocator,size_t size,size_t alignment)

{
  sysbvm_chunkedAllocatorChunk_s *psVar1;
  _Bool _Var2;
  sysbvm_chunkedAllocatorChunk_t *psVar3;
  void *pvVar4;
  bool bVar5;
  sysbvm_chunkedAllocatorChunk_t *newChunkWriteableMapping;
  sysbvm_chunkedAllocatorChunk_t *newChunkExecutableMapping;
  sysbvm_chunkedAllocatorChunk_s *local_20;
  sysbvm_chunkedAllocatorChunk_s *local_18;
  
  psVar3 = allocator->currentChunk;
  bVar5 = psVar3 == (sysbvm_chunkedAllocatorChunk_t *)0x0;
  if (!bVar5) {
    do {
      if (((alignment + size) - 1 & -alignment) <=
          psVar3->capacity - (psVar3->size + (alignment - 1) & -alignment)) {
        if (!bVar5) goto LAB_00156a88;
        break;
      }
      psVar3 = psVar3->next;
      allocator->currentChunk = psVar3;
      bVar5 = psVar3 == (sysbvm_chunkedAllocatorChunk_s *)0x0;
    } while (!bVar5);
  }
  local_20 = (sysbvm_chunkedAllocatorChunk_t *)0x0;
  local_18 = (sysbvm_chunkedAllocatorChunk_s *)0x0;
  if (allocator->requiresExecutableMapping == true) {
    _Var2 = sysbvm_virtualMemory_hasSupportForRWXMapping();
    if (_Var2) {
      local_20 = (sysbvm_chunkedAllocatorChunk_s *)
                 sysbvm_virtualMemory_allocateSystemMemory(allocator->chunkSize);
      local_20->capacity = 0;
      local_20->size = 0;
      local_20->dualMappingHandle = (void *)0x0;
      local_20->reserved = (void *)0x0;
      local_20->writeableMapping = (sysbvm_chunkedAllocatorChunk_s *)0x0;
      local_20->executableMapping = (sysbvm_chunkedAllocatorChunk_s *)0x0;
      local_20->previous = (sysbvm_chunkedAllocatorChunk_s *)0x0;
      local_20->next = (sysbvm_chunkedAllocatorChunk_s *)0x0;
      local_18 = local_20;
    }
    else {
      pvVar4 = sysbvm_virtualMemory_allocateSystemMemoryWithDualMapping
                         (allocator->chunkSize,&local_20,&local_18);
      local_20->dualMappingHandle = (void *)0x0;
      local_20->reserved = (void *)0x0;
      local_20->previous = (sysbvm_chunkedAllocatorChunk_s *)0x0;
      local_20->next = (sysbvm_chunkedAllocatorChunk_s *)0x0;
      local_20->writeableMapping = (sysbvm_chunkedAllocatorChunk_s *)0x0;
      local_20->executableMapping = (sysbvm_chunkedAllocatorChunk_s *)0x0;
      local_20->capacity = 0;
      local_20->size = 0;
      local_20->dualMappingHandle = pvVar4;
    }
  }
  else {
    local_20 = (sysbvm_chunkedAllocatorChunk_s *)
               sysbvm_virtualMemory_allocateSystemMemory(allocator->chunkSize);
    local_20->previous = (sysbvm_chunkedAllocatorChunk_s *)0x0;
    local_20->next = (sysbvm_chunkedAllocatorChunk_s *)0x0;
    local_20->writeableMapping = (sysbvm_chunkedAllocatorChunk_s *)0x0;
    local_20->executableMapping = (sysbvm_chunkedAllocatorChunk_s *)0x0;
    local_20->dualMappingHandle = (void *)0x0;
    local_20->reserved = (void *)0x0;
    local_20->capacity = 0;
    local_20->size = 0;
  }
  local_20->capacity = allocator->chunkSize - 0x40;
  local_20->writeableMapping = local_20;
  local_20->executableMapping = local_18;
  if (allocator->firstChunk == (sysbvm_chunkedAllocatorChunk_t *)0x0) {
    allocator->firstChunk = local_20;
  }
  psVar3 = allocator->lastChunk;
  if (psVar3 != (sysbvm_chunkedAllocatorChunk_t *)0x0) {
    if ((allocator->requiresExecutableMapping == true) &&
       (_Var2 = sysbvm_virtualMemory_lockCodePagesForWriting
                          (psVar3->writeableMapping,psVar3->executableMapping,0x40), !_Var2)) {
      abort();
    }
    psVar1 = allocator->lastChunk;
    psVar1->next = local_20;
    local_20->previous = psVar1;
    if (allocator->requiresExecutableMapping == true) {
      sysbvm_virtualMemory_unlockCodePagesForExecution
                (psVar1->writeableMapping,psVar1->executableMapping,0x40);
    }
  }
  allocator->lastChunk = local_20;
  allocator->currentChunk = local_20;
LAB_00156a88:
  return allocator->currentChunk;
}

Assistant:

static sysbvm_chunkedAllocatorChunk_t *sysbvm_chunkedAllocator_ensureChunkWithRequiredCapacity(sysbvm_chunkedAllocator_t *allocator, size_t size, size_t alignment)
{
    sysbvm_chunkedAllocatorChunk_t **currentChunk = &allocator->currentChunk;

    // Advance the current chunk.
    size_t requiredAlignedSize = sysbvm_chunkedAllocator_sizeAlignedTo(size, alignment);
    while(*currentChunk && ((*currentChunk)->capacity - sysbvm_chunkedAllocator_sizeAlignedTo((*currentChunk)->size, alignment)) < requiredAlignedSize)
        *currentChunk = (*currentChunk)->next;

    // Create a new chunk if needed
    if(*currentChunk == NULL)
    {
        sysbvm_chunkedAllocatorChunk_t *newChunkWriteableMapping = NULL;
        sysbvm_chunkedAllocatorChunk_t *newChunkExecutableMapping = NULL;

        if(allocator->requiresExecutableMapping)
        {
            if(sysbvm_virtualMemory_hasSupportForRWXMapping())
            {
                newChunkExecutableMapping = newChunkWriteableMapping = (sysbvm_chunkedAllocatorChunk_t*)sysbvm_virtualMemory_allocateSystemMemory(allocator->chunkSize);
                memset(newChunkWriteableMapping, 0, sizeof(sysbvm_chunkedAllocatorChunk_t));
            }
            else
            {
                void *handle = sysbvm_virtualMemory_allocateSystemMemoryWithDualMapping(allocator->chunkSize, (void**)&newChunkWriteableMapping, (void**)&newChunkExecutableMapping);
                memset(newChunkWriteableMapping, 0, sizeof(sysbvm_chunkedAllocatorChunk_t));
                newChunkWriteableMapping->dualMappingHandle = handle;
            }
        }
        else
        {
            newChunkWriteableMapping = (sysbvm_chunkedAllocatorChunk_t*)sysbvm_virtualMemory_allocateSystemMemory(allocator->chunkSize);
            memset(newChunkWriteableMapping, 0, sizeof(sysbvm_chunkedAllocatorChunk_t));
        }
        
        newChunkWriteableMapping->capacity = allocator->chunkSize - sizeof(sysbvm_chunkedAllocatorChunk_t);
        newChunkWriteableMapping->writeableMapping = newChunkWriteableMapping;
        newChunkWriteableMapping->executableMapping = newChunkExecutableMapping;

        if(!allocator->firstChunk)
            allocator->firstChunk = newChunkWriteableMapping;

        if(allocator->lastChunk)
        {
            if(allocator->requiresExecutableMapping &&
                !sysbvm_virtualMemory_lockCodePagesForWriting(allocator->lastChunk->writeableMapping, allocator->lastChunk->executableMapping, sizeof(sysbvm_chunkedAllocatorChunk_t)))
                abort();

            allocator->lastChunk->next = newChunkWriteableMapping;
            newChunkWriteableMapping->previous = allocator->lastChunk;

            if(allocator->requiresExecutableMapping)
                sysbvm_virtualMemory_unlockCodePagesForExecution(allocator->lastChunk->writeableMapping, allocator->lastChunk->executableMapping, sizeof(sysbvm_chunkedAllocatorChunk_t));
        }
        allocator->lastChunk = newChunkWriteableMapping;

        *currentChunk = newChunkWriteableMapping;
    }

    return *currentChunk;

}